

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O1

void pbrt::PiecewiseConstant1D::TestCompareDistributions
               (PiecewiseConstant1D *da,PiecewiseConstant1D *db,Float eps)

{
  internal iVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  AssertionResult gtest_ar;
  Float err;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  AssertHelper local_58;
  internal local_50 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  float local_40;
  float local_3c;
  float local_38;
  Float local_34;
  
  local_60.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(da->func).nStored
  ;
  local_58.data_ = (AssertHelperData *)(db->func).nStored;
  local_34 = eps;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_50,"da.func.size()","db.func.size()",(unsigned_long *)&local_60,
             (unsigned_long *)&local_58);
  iVar1 = local_50[0];
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_48.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_48.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling.cpp"
               ,0x22a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_60.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_60.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_60.ptr_ + 8))();
      }
      local_60.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (iVar1 != (internal)0x0) {
    local_60.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (da->cdf).nStored;
    local_58.data_ = (AssertHelperData *)(db->cdf).nStored;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              (local_50,"da.cdf.size()","db.cdf.size()",(unsigned_long *)&local_60,
               (unsigned_long *)&local_58);
    iVar1 = local_50[0];
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_60);
      if (local_48.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_48.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling.cpp"
                 ,0x22b,pcVar3);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if (local_60.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_60.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_60.ptr_ + 8))();
        }
        local_60.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (iVar1 != (internal)0x0) {
      testing::internal::CmpHelperEQ<float,float>(local_50,"da.min","db.min",&da->min,&db->min);
      iVar1 = local_50[0];
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_60);
        if (local_48.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((local_48.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling.cpp"
                   ,0x22c,pcVar3);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (local_60.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_60.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_60.ptr_ + 8))();
          }
          local_60.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (iVar1 != (internal)0x0) {
        testing::internal::CmpHelperEQ<float,float>(local_50,"da.max","db.max",&da->max,&db->max);
        iVar1 = local_50[0];
        if (local_50[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_60);
          if (local_48.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = ((local_48.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling.cpp"
                     ,0x22d,pcVar3);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
          testing::internal::AssertHelper::~AssertHelper(&local_58);
          if (local_60.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               (local_60.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_60.ptr_ + 8))();
            }
            local_60.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        if ((iVar1 != (internal)0x0) && ((da->func).nStored != 0)) {
          uVar4 = 0;
          do {
            local_3c = (da->func).ptr[uVar4] / da->funcInt;
            local_40 = (db->func).ptr[uVar4] / db->funcInt;
            auVar5._8_4_ = 0x7fffffff;
            auVar5._0_8_ = 0x7fffffff7fffffff;
            auVar5._12_4_ = 0x7fffffff;
            auVar5 = vandps_avx512vl(ZEXT416((uint)(local_3c - local_40)),auVar5);
            local_38 = auVar5._0_4_ / ((local_3c + local_40) * 0.5);
            testing::internal::CmpHelperLT<float,float>(local_50,"err","eps",&local_38,&local_34);
            if (local_50[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_60);
              std::ostream::_M_insert<double>((double)local_3c);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_60.ptr_ + 0x10)," - ",3);
              std::ostream::_M_insert<double>((double)local_40);
              pcVar3 = "";
              if (local_48.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar3 = ((local_48.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_58,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling.cpp"
                         ,0x231,pcVar3);
              testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
              testing::internal::AssertHelper::~AssertHelper(&local_58);
              if (local_60.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar2 = testing::internal::IsTrue(true);
                if ((bVar2) &&
                   (local_60.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)local_60.ptr_ + 8))();
                }
                local_60.ptr_ =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_48,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            uVar4 = uVar4 + 1;
          } while (uVar4 < (da->func).nStored);
        }
      }
    }
  }
  return;
}

Assistant:

void PiecewiseConstant1D::TestCompareDistributions(const PiecewiseConstant1D &da,
                                                   const PiecewiseConstant1D &db,
                                                   Float eps) {
    ASSERT_EQ(da.func.size(), db.func.size());
    ASSERT_EQ(da.cdf.size(), db.cdf.size());
    ASSERT_EQ(da.min, db.min);
    ASSERT_EQ(da.max, db.max);
    for (size_t i = 0; i < da.func.size(); ++i) {
        Float pdfa = da.func[i] / da.funcInt, pdfb = db.func[i] / db.funcInt;
        Float err = std::abs(pdfa - pdfb) / ((pdfa + pdfb) / 2);
        EXPECT_LT(err, eps) << pdfa << " - " << pdfb;
    }
}